

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_receive(ptls_t *tls,ptls_buffer_t *decryptbuf,void *_input,size_t *inlen)

{
  void *pvVar1;
  size_t sVar2;
  int iVar3;
  size_t consumed;
  size_t local_40;
  size_t *local_38;
  
  if (PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY < tls->state) {
    pvVar1 = (void *)((long)_input + *inlen);
    iVar3 = 0;
    local_38 = inlen;
    if ((*inlen != 0) && (sVar2 = decryptbuf->off, iVar3 = 0, sVar2 == decryptbuf->off)) {
      do {
        local_40 = (long)pvVar1 - (long)_input;
        iVar3 = handle_input(tls,(ptls_message_emitter_t *)0x0,decryptbuf,_input,&local_40,
                             (ptls_handshake_properties_t *)0x0);
        _input = (void *)((long)_input + local_40);
        if (iVar3 == 0x202) {
          iVar3 = 0;
        }
      } while (((iVar3 == 0) && (_input != pvVar1)) && (sVar2 == decryptbuf->off));
    }
    *local_38 = (long)_input + (*local_38 - (long)pvVar1);
    return iVar3;
  }
  __assert_fail("tls->state >= PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                ,0x131c,"int ptls_receive(ptls_t *, ptls_buffer_t *, const void *, size_t *)");
}

Assistant:

int ptls_receive(ptls_t *tls, ptls_buffer_t *decryptbuf, const void *_input, size_t *inlen)
{
    const uint8_t *input = (const uint8_t *)_input, *const end = input + *inlen;
    size_t decryptbuf_orig_size = decryptbuf->off;
    int ret = 0;

    assert(tls->state >= PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA);

    /* loop until we decrypt some application data (or an error) */
    while (ret == 0 && input != end && decryptbuf_orig_size == decryptbuf->off) {
        size_t consumed = end - input;
        ret = handle_input(tls, NULL, decryptbuf, input, &consumed, NULL);
        input += consumed;

        switch (ret) {
        case 0:
            break;
        case PTLS_ERROR_IN_PROGRESS:
            ret = 0;
            break;
        case PTLS_ERROR_CLASS_PEER_ALERT + PTLS_ALERT_CLOSE_NOTIFY:
            /* TODO send close alert */
            break;
        default:
            if (PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT) {
                /* TODO send alert */
            }
            break;
        }
    }

    *inlen -= end - input;

    return ret;
}